

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O2

int gutil::Thread::getProcessingUnits(void)

{
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  char *__nptr;
  uint uVar4;
  uint uVar5;
  
  uVar4 = (anonymous_namespace)::procunits;
  if ((int)(anonymous_namespace)::procunits < 1) {
    lVar2 = sysconf(0x53);
    (anonymous_namespace)::procunits = (uint)lVar2;
    if ((int)(anonymous_namespace)::procunits < 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Cannot determine number of CPUs, assuming one!");
      std::endl<char,std::char_traits<char>>(poVar3);
      (anonymous_namespace)::procunits = 1;
    }
    uVar4 = (anonymous_namespace)::procunits;
    __nptr = getenv("CVKIT_MAX_THREADS");
    if (__nptr != (char *)0x0) {
      uVar1 = atoi(__nptr);
      uVar5 = 1;
      if (1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      if (uVar5 < uVar4) {
        uVar4 = uVar5;
        (anonymous_namespace)::procunits = uVar5;
      }
    }
  }
  return uVar4;
}

Assistant:

int Thread::getProcessingUnits()
{
  if (procunits <= 0)
  {
#ifdef _SC_NPROCESSORS_CONF
    procunits=sysconf(_SC_NPROCESSORS_CONF);
#endif

    if (procunits <= 0)
    {
      std::cerr << "Cannot determine number of CPUs, assuming one!" << std::endl;
      procunits=1;
    }

    const char *s=std::getenv("CVKIT_MAX_THREADS");

    if (s != 0)
    {
      int n=std::max(1, std::atoi(s));

      if (n < procunits)
      {
        procunits=n;
      }
    }
  }

  return procunits;
}